

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XNA_Song.c
# Opt level: O0

void XNA_SongInit(void)

{
  undefined8 in_RAX;
  FAudio **unaff_retaddr;
  uint32_t in_stack_00000430;
  uint32_t in_stack_00000434;
  uint32_t in_stack_00000438;
  uint32_t in_stack_0000043c;
  FAudioMasteringVoice **in_stack_00000440;
  FAudio *in_stack_00000448;
  FAudioEffectChain *in_stack_00000460;
  
  FAudioCreate(unaff_retaddr,(uint32_t)((ulong)in_RAX >> 0x20),(FAudioProcessor)in_RAX);
  FAudio_CreateMasteringVoice
            (in_stack_00000448,in_stack_00000440,in_stack_0000043c,in_stack_00000438,
             in_stack_00000434,in_stack_00000430,in_stack_00000460);
  return;
}

Assistant:

FAUDIOAPI void XNA_SongInit()
{
	FAudioCreate(&songAudio, 0, FAUDIO_DEFAULT_PROCESSOR);
	FAudio_CreateMasteringVoice(
		songAudio,
		&songMaster,
		FAUDIO_DEFAULT_CHANNELS,
		FAUDIO_DEFAULT_SAMPLERATE,
		0,
		0,
		NULL
	);
}